

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O1

bool __thiscall OSToken::clearToken(OSToken *this)

{
  Directory *pDVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenFiles;
  MutexLocker lock;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  MutexLocker local_80;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  MutexLocker::MutexLocker(&local_80,this->tokenMutex);
  (*(this->super_ObjectStoreToken)._vptr_ObjectStoreToken[0xf])(this);
  std::
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  ::clear(&(this->objects)._M_t);
  bVar3 = Directory::refresh(this->tokenDir);
  if (bVar3) {
    Directory::getFiles_abi_cxx11_(&local_98,this->tokenDir);
    if (local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar5 = local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pDVar1 = this->tokenDir;
        pcVar2 = (pbVar5->_M_dataplus)._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar2,pcVar2 + pbVar5->_M_string_length);
        iVar4 = Directory::remove(pDVar1,(char *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if ((char)iVar4 == '\0') {
          bVar3 = false;
          softHSMLog(3,"clearToken",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x1d9,"Failed to remove %s from token directory %s",(pbVar5->_M_dataplus)._M_p
                     ,(this->tokenPath)._M_dataplus._M_p);
          goto LAB_0012c658;
        }
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != local_98.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    pDVar1 = this->tokenDir;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
    iVar4 = Directory::rmdir(pDVar1,(char *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    pcVar2 = (this->tokenPath)._M_dataplus._M_p;
    if ((char)iVar4 == '\0') {
      bVar3 = false;
      softHSMLog(3,"clearToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x1e2,"Failed to remove the token directory %s",pcVar2);
    }
    else {
      bVar3 = true;
      softHSMLog(7,"clearToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x1e7,"Token instance %s was succesfully cleared",pcVar2);
    }
LAB_0012c658:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
  }
  else {
    bVar3 = false;
  }
  MutexLocker::~MutexLocker(&local_80);
  return bVar3;
}

Assistant:

bool OSToken::clearToken()
{
	MutexLocker lock(tokenMutex);

	// Invalidate the token
	invalidate();

	// First, clear out all objects
	objects.clear();

	// Now, delete all files in the token directory
	if (!tokenDir->refresh())
	{
		return false;
	}

	std::vector<std::string> tokenFiles = tokenDir->getFiles();

	for (std::vector<std::string>::iterator i = tokenFiles.begin(); i != tokenFiles.end(); i++)
	{
		if (!tokenDir->remove(*i))
		{
			ERROR_MSG("Failed to remove %s from token directory %s", i->c_str(), tokenPath.c_str());

			return false;
		}
	}

	// Now remove the token directory
	if (!tokenDir->rmdir(""))
	{
		ERROR_MSG("Failed to remove the token directory %s", tokenPath.c_str());

		return false;
	}

	DEBUG_MSG("Token instance %s was succesfully cleared", tokenPath.c_str());

	return true;
}